

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void arg_print_syntax_ds(arg_dstr_t ds,void **argtable,char *suffix)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  char *dest_4;
  char *pcVar4;
  byte *pbVar5;
  size_t __n;
  void *pvVar6;
  char cVar7;
  int iVar8;
  char *dest;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  char *dest_2;
  char *pcVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  void **ppvVar16;
  bool bVar17;
  char syntax [200];
  char local_10b [3];
  void **local_108;
  char *local_100;
  char local_f8 [200];
  
  pbVar5 = (byte *)*argtable;
  pcVar12 = "";
  local_108 = argtable;
  local_100 = suffix;
  if (pbVar5 != (byte *)0x0) {
    ppvVar16 = argtable + 1;
    pcVar4 = " -%c";
    pcVar14 = " [-%c";
    do {
      if ((*pbVar5 & 1) != 0) break;
      if ((0 < *(int *)(pbVar5 + 0x28)) &&
         ((char)((*pbVar5 & 2) >> 1) == '\0' && *(char **)(pbVar5 + 8) != (char *)0x0)) {
        arg_dstr_catf(ds,pcVar4,(ulong)(uint)(int)**(char **)(pbVar5 + 8));
        pcVar4 = "%c";
        pcVar14 = "[%c";
      }
      pbVar5 = (byte *)*ppvVar16;
      ppvVar16 = ppvVar16 + 1;
    } while (pbVar5 != (byte *)0x0);
    pbVar5 = (byte *)*local_108;
    if (pbVar5 != (byte *)0x0) {
      pcVar12 = "";
      ppvVar16 = local_108;
      do {
        ppvVar16 = ppvVar16 + 1;
        if ((*pbVar5 & 1) != 0) break;
        if ((*(int *)(pbVar5 + 0x28) < 1) &&
           ((char)((*pbVar5 & 2) >> 1) == '\0' && *(char **)(pbVar5 + 8) != (char *)0x0)) {
          arg_dstr_catf(ds,pcVar14,(ulong)(uint)(int)**(char **)(pbVar5 + 8));
          pcVar14 = "%c";
          pcVar12 = "]";
        }
        pbVar5 = (byte *)*ppvVar16;
      } while (pbVar5 != (byte *)0x0);
    }
  }
  lVar13 = 0;
  arg_dstr_catf(ds,"%s",pcVar12);
  pbVar5 = (byte *)*local_108;
  ppvVar16 = local_108;
joined_r0x00109038:
  if (pbVar5 != (byte *)0x0) {
    pcVar12 = local_f8 + 199;
    if ((*pbVar5 & 1) == 0) {
      memset(local_f8,0,200);
      if (*(undefined1 **)(pbVar5 + 8) == (undefined1 *)0x0) {
        pcVar4 = *(char **)(pbVar5 + 0x10);
        pcVar14 = *(char **)(pbVar5 + 0x18);
        bVar3 = *pbVar5;
        if (pcVar4 != (char *)0x0) {
          uVar9 = 0;
          do {
            if (local_f8[uVar9] == '\0') {
              if (uVar9 < 199) {
                lVar15 = 0;
                goto LAB_001091f0;
              }
              pcVar10 = local_f8 + uVar9;
              break;
            }
            uVar9 = uVar9 + 1;
            pcVar10 = pcVar12;
          } while (uVar9 != 199);
          goto LAB_001092c1;
        }
        ppvVar16 = local_108;
        if (pcVar14 != (char *)0x0) {
          if ((bVar3 & 4) != 0) {
            pcVar12 = local_f8;
            uVar9 = 0;
            pcVar4 = local_f8 + 199;
            do {
              if (*pcVar12 == '\0') {
                pcVar10 = pcVar12;
                if (uVar9 < 199) {
                  *pcVar12 = '[';
                  pcVar10 = pcVar12 + 1;
                }
                break;
              }
              uVar9 = uVar9 + 1;
              pcVar12 = pcVar12 + 1;
              pcVar10 = pcVar4;
            } while (uVar9 != 199);
            *pcVar10 = '\0';
            if (pcVar4 != pcVar10 && -1 < (long)pcVar4 - (long)pcVar10) {
              do {
                if (*pcVar10 == '\0') break;
                pcVar10 = pcVar10 + 1;
              } while (pcVar10 < pcVar4);
            }
            pcVar12 = pcVar10;
            if (pcVar10 < pcVar4) {
              pcVar12 = pcVar10 + ((long)pcVar4 - (long)pcVar10);
              lVar15 = 0;
              do {
                if (pcVar14[lVar15] == '\0') {
                  pcVar12 = pcVar10 + lVar15;
                  break;
                }
                pcVar10[lVar15] = pcVar14[lVar15];
                lVar15 = lVar15 + 1;
              } while ((long)pcVar4 - (long)pcVar10 != lVar15);
            }
            bVar17 = -1 < (long)pcVar4 - (long)pcVar12;
            cVar7 = '\0';
            if (pcVar4 != pcVar12 && bVar17) {
              cVar7 = ']';
            }
            *pcVar12 = cVar7;
            pcVar12[pcVar4 != pcVar12 && bVar17] = '\0';
            goto LAB_00109483;
          }
          uVar9 = 0;
          pcVar12 = local_f8 + 199;
          do {
            if (local_f8[uVar9] == '\0') {
              if (uVar9 < 199) goto LAB_001093df;
              goto LAB_00109453;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != 199);
          goto LAB_0010945a;
        }
        goto LAB_00109483;
      }
      bVar3 = *pbVar5;
      if ((bVar3 & 2) != 0) {
        pcVar4 = *(char **)(pbVar5 + 0x18);
        local_10b[0] = '-';
        local_10b[1] = **(undefined1 **)(pbVar5 + 8);
        local_10b[2] = 0;
        uVar9 = 0;
        do {
          pcVar14 = pcVar12;
          if (local_f8[uVar9] == '\0') {
            if (0xc6 < uVar9) goto LAB_00109151;
            pcVar10 = local_10b;
            goto LAB_001090ec;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != 199);
        goto LAB_00109158;
      }
      goto LAB_00109546;
    }
  }
  if (local_100 != (char *)0x0) {
    arg_dstr_cat(ds,local_100);
  }
  return;
  while( true ) {
    lVar1 = lVar15 + 1;
    local_f8[lVar15 + uVar9] = "--"[lVar15];
    lVar2 = uVar9 + lVar15;
    lVar15 = lVar1;
    if (lVar2 == 0xc6) break;
LAB_001091f0:
    if (lVar15 == 2) {
      pcVar10 = local_f8 + uVar9 + 2;
      goto LAB_001092c1;
    }
  }
  pcVar10 = local_f8 + lVar1 + uVar9;
LAB_001092c1:
  *pcVar10 = '\0';
  uVar9 = (long)pcVar12 - (long)pcVar10;
  __n = strcspn(pcVar4,",");
  if (uVar9 <= __n) {
    __n = uVar9;
  }
  strncat(pcVar10,pcVar4,__n);
  ppvVar16 = local_108;
  if (pcVar14 != (char *)0x0) {
    pcVar12 = pcVar10 + uVar9;
    pcVar4 = local_f8 + 199;
    if (0 < (long)uVar9) {
      do {
        if (*pcVar10 == '\0') break;
        pcVar10 = pcVar10 + 1;
      } while (pcVar10 < pcVar12);
    }
    if (pcVar10 < pcVar12) {
      *pcVar10 = '=';
      pcVar10 = pcVar10 + 1;
    }
    *pcVar10 = '\0';
    lVar15 = (long)pcVar4 - (long)pcVar10;
    pcVar12 = pcVar10 + lVar15;
    if ((bVar3 & 4) == 0) {
      if (0 < lVar15) {
        do {
          if (*pcVar10 == '\0') break;
          pcVar10 = pcVar10 + 1;
        } while (pcVar10 < pcVar12);
      }
      if (pcVar10 < pcVar12) {
        lVar15 = 0;
        do {
          if (pcVar14[lVar15] == '\0') break;
          pcVar10[lVar15] = pcVar14[lVar15];
          lVar15 = lVar15 + 1;
        } while ((long)pcVar4 - (long)pcVar10 != lVar15);
        pcVar10 = pcVar10 + lVar15;
      }
    }
    else {
      if (0 < lVar15) {
        do {
          if (*pcVar10 == '\0') break;
          pcVar10 = pcVar10 + 1;
        } while (pcVar10 < pcVar12);
      }
      if (pcVar10 < pcVar12) {
        *pcVar10 = '[';
        pcVar10 = pcVar10 + 1;
      }
      *pcVar10 = '\0';
      if (0 < (long)pcVar4 - (long)pcVar10) {
        pcVar12 = pcVar10 + ((long)pcVar4 - (long)pcVar10);
        do {
          cVar7 = *pcVar14;
          if (cVar7 == '\0') break;
          pcVar14 = pcVar14 + 1;
          *pcVar10 = cVar7;
          pcVar10 = pcVar10 + 1;
        } while (pcVar10 < pcVar12);
        *pcVar10 = '\0';
        if (pcVar4 != pcVar10 && -1 < (long)pcVar4 - (long)pcVar10) {
          *pcVar10 = ']';
          pcVar10 = pcVar10 + 1;
        }
      }
    }
    *pcVar10 = '\0';
  }
  goto LAB_00109483;
  while( true ) {
    pcVar14 = pcVar14 + 1;
    local_f8[uVar9] = cVar7;
    uVar9 = uVar9 + 1;
    if (uVar9 == 199) break;
LAB_001093df:
    cVar7 = *pcVar14;
    if (cVar7 == '\0') goto LAB_00109453;
  }
LAB_0010945a:
  *pcVar12 = '\0';
  goto LAB_00109483;
LAB_00109453:
  pcVar12 = local_f8 + uVar9;
  goto LAB_0010945a;
  while( true ) {
    pcVar10 = pcVar10 + 1;
    local_f8[uVar9] = cVar7;
    uVar9 = uVar9 + 1;
    if (uVar9 == 199) break;
LAB_001090ec:
    cVar7 = *pcVar10;
    if (cVar7 == '\0') goto LAB_00109151;
  }
LAB_00109158:
  *pcVar14 = '\0';
  if (pcVar4 != (char *)0x0) {
    if (pcVar12 != pcVar14 && -1 < (long)pcVar12 - (long)pcVar14) {
      do {
        if (*pcVar14 == '\0') break;
        pcVar14 = pcVar14 + 1;
      } while (pcVar14 < pcVar12);
    }
    if (pcVar14 < pcVar12) {
      *pcVar14 = ' ';
      pcVar14 = pcVar14 + 1;
    }
    *pcVar14 = '\0';
    lVar15 = (long)pcVar12 - (long)pcVar14;
    pcVar10 = pcVar14 + lVar15;
    if ((bVar3 & 4) == 0) {
      if (0 < lVar15) {
        do {
          if (*pcVar14 == '\0') break;
          pcVar14 = pcVar14 + 1;
        } while (pcVar14 < pcVar10);
      }
      if (pcVar14 < pcVar10) {
        lVar15 = 0;
        do {
          if (pcVar4[lVar15] == '\0') break;
          pcVar14[lVar15] = pcVar4[lVar15];
          lVar15 = lVar15 + 1;
        } while ((long)pcVar12 - (long)pcVar14 != lVar15);
        pcVar14 = pcVar14 + lVar15;
      }
    }
    else {
      if (0 < lVar15) {
        do {
          if (*pcVar14 == '\0') break;
          pcVar14 = pcVar14 + 1;
        } while (pcVar14 < pcVar10);
      }
      if (pcVar14 < pcVar10) {
        *pcVar14 = '[';
        pcVar14 = pcVar14 + 1;
      }
      *pcVar14 = '\0';
      if (0 < (long)pcVar12 - (long)pcVar14) {
        pcVar10 = pcVar14 + ((long)pcVar12 - (long)pcVar14);
        do {
          cVar7 = *pcVar4;
          if (cVar7 == '\0') break;
          pcVar4 = pcVar4 + 1;
          *pcVar14 = cVar7;
          pcVar14 = pcVar14 + 1;
        } while (pcVar14 < pcVar10);
        *pcVar14 = '\0';
        if (pcVar12 != pcVar14 && -1 < (long)pcVar12 - (long)pcVar14) {
          *pcVar14 = ']';
          pcVar14 = pcVar14 + 1;
        }
      }
    }
    *pcVar14 = '\0';
  }
LAB_00109483:
  if (local_f8[0] != '\0') {
    pvVar6 = ppvVar16[lVar13];
    iVar8 = *(int *)((long)pvVar6 + 0x28);
    if (0 < iVar8) {
      iVar11 = 0;
      do {
        arg_dstr_cat(ds," ");
        arg_dstr_cat(ds,local_f8);
        iVar11 = iVar11 + 1;
        pvVar6 = ppvVar16[lVar13];
        iVar8 = *(int *)((long)pvVar6 + 0x28);
      } while (iVar11 < iVar8);
    }
    iVar11 = *(int *)((long)pvVar6 + 0x2c) - iVar8;
    if (*(int *)((long)pvVar6 + 0x2c) != iVar8) {
      pcVar12 = "]";
      if (iVar11 != 1) {
        if (iVar11 == 2) {
          arg_dstr_cat(ds," [");
          arg_dstr_cat(ds,local_f8);
          pcVar12 = "]";
          arg_dstr_cat(ds,"]");
        }
        else {
          pcVar12 = "]...";
        }
      }
      arg_dstr_cat(ds," [");
      arg_dstr_cat(ds,local_f8);
      arg_dstr_cat(ds,pcVar12);
    }
  }
LAB_00109546:
  pbVar5 = (byte *)ppvVar16[lVar13 + 1];
  lVar13 = lVar13 + 1;
  goto joined_r0x00109038;
LAB_00109151:
  pcVar14 = local_f8 + uVar9;
  goto LAB_00109158;
}

Assistant:

void arg_print_syntax_ds(arg_dstr_t ds, void** argtable, const char* suffix) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int i, tabindex;

    /* print GNU style [OPTION] string */
    arg_print_gnuswitch_ds(ds, table);

    /* print remaining options in abbreviated style */
    for (tabindex = 0; table[tabindex] && !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        char syntax[200] = "";
        const char *shortopts, *longopts, *datatype;

        /* skip short options without arg values (they were printed by arg_print_gnu_switch) */
        if (table[tabindex]->shortopts && !(table[tabindex]->flag & ARG_HASVALUE))
            continue;

        shortopts = table[tabindex]->shortopts;
        longopts = table[tabindex]->longopts;
        datatype = table[tabindex]->datatype;
        arg_cat_option(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE);

        if (strlen(syntax) > 0) {
            /* print mandatory instances of this option */
            for (i = 0; i < table[tabindex]->mincount; i++) {
                arg_dstr_cat(ds, " ");
                arg_dstr_cat(ds, syntax);
            }

            /* print optional instances enclosed in "[..]" */
            switch (table[tabindex]->maxcount - table[tabindex]->mincount) {
                case 0:
                    break;
                case 1:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    break;
                case 2:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]");
                    break;
                default:
                    arg_dstr_cat(ds, " [");
                    arg_dstr_cat(ds, syntax);
                    arg_dstr_cat(ds, "]...");
                    break;
            }
        }
    }

    if (suffix) {
        arg_dstr_cat(ds, (char*)suffix);
    }
}